

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnMemory(SharedValidator *this,Location *loc,Limits *limits)

{
  pointer *ppMVar1;
  iterator __position;
  uint64_t uVar2;
  uint64_t uVar3;
  bool bVar4;
  undefined5 uVar5;
  Result RVar6;
  char *format;
  byte bVar7;
  bool bVar8;
  MemoryType local_48;
  
  if ((this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar8 = false;
  }
  else {
    RVar6 = PrintError(this,loc,"only one memory block allowed");
    bVar8 = RVar6.enum_ == Error;
  }
  RVar6 = CheckLimits(this,loc,limits,0x10000,"pages");
  bVar7 = RVar6.enum_ == Error | bVar8;
  if (limits->is_shared == true) {
    if ((this->options_).features.threads_enabled_ == true) {
      if (limits->has_max != false) goto LAB_0016e3a7;
      format = "shared memories must have max sizes";
    }
    else {
      format = "memories may not be shared";
    }
    RVar6 = PrintError(this,loc,format);
    bVar7 = bVar7 | RVar6.enum_ == Error;
  }
LAB_0016e3a7:
  local_48.limits.has_max = limits->has_max;
  local_48.limits.is_shared = limits->is_shared;
  local_48.limits.is_64 = limits->is_64;
  local_48.limits._19_5_ = *(undefined5 *)&limits->field_0x13;
  local_48.limits.initial = limits->initial;
  local_48.limits.max = limits->max;
  __position._M_current =
       (this->memories_).
       super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>::
    _M_realloc_insert<wabt::SharedValidator::MemoryType>(&this->memories_,__position,&local_48);
  }
  else {
    uVar2 = limits->initial;
    uVar3 = limits->max;
    bVar8 = limits->is_shared;
    bVar4 = limits->is_64;
    uVar5 = *(undefined5 *)&limits->field_0x13;
    ((__position._M_current)->limits).has_max = limits->has_max;
    ((__position._M_current)->limits).is_shared = bVar8;
    ((__position._M_current)->limits).is_64 = bVar4;
    *(undefined5 *)&((__position._M_current)->limits).field_0x13 = uVar5;
    ((__position._M_current)->limits).initial = uVar2;
    ((__position._M_current)->limits).max = uVar3;
    ppMVar1 = &(this->memories_).
               super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  RVar6.enum_._1_3_ = 0;
  RVar6.enum_._0_1_ = bVar7;
  return (Result)RVar6.enum_;
}

Assistant:

Result SharedValidator::OnMemory(const Location& loc, const Limits& limits) {
  Result result = Result::Ok;
  if (memories_.size() > 0) {
    result |= PrintError(loc, "only one memory block allowed");
  }
  result |= CheckLimits(loc, limits, WABT_MAX_PAGES, "pages");

  if (limits.is_shared) {
    if (!options_.features.threads_enabled()) {
      result |= PrintError(loc, "memories may not be shared");
    } else if (!limits.has_max) {
      result |= PrintError(loc, "shared memories must have max sizes");
    }
  }

  memories_.push_back(MemoryType{limits});
  return result;
}